

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int doprring(void)

{
  undefined8 in_RAX;
  ulong uVar1;
  bool bVar2;
  undefined6 uStack_8;
  char lets [3];
  
  if (uleft == (obj *)0x0 && uright == (obj *)0x0) {
    pline("You are not wearing any rings.");
  }
  else {
    bVar2 = uleft != (obj *)0x0;
    _uStack_8 = in_RAX;
    if (bVar2) {
      lets._1_2_ = (undefined2)((ulong)in_RAX >> 0x30);
      uStack_8 = CONCAT15(uleft->invlet,(int5)in_RAX);
    }
    uVar1 = (ulong)bVar2;
    if (uright != (obj *)0x0) {
      uVar1 = (ulong)(bVar2 + 1);
      lets[bVar2] = uright->invlet;
    }
    lets[uVar1] = '\0';
    display_inventory(lets,'\0');
  }
  return 0;
}

Assistant:

int doprring(void)
{
	if (!uleft && !uright)
		pline("You are not wearing any rings.");
	else {
		char lets[3];
		int ct = 0;

		if (uleft) lets[ct++] = obj_to_let(uleft);
		if (uright) lets[ct++] = obj_to_let(uright);
		lets[ct] = 0;
		display_inventory(lets, FALSE);
	}
	return 0;
}